

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

int __thiscall
common::Config::GetHosts
          (Config *this,string *group,string *tag,
          vector<common::Host,_std::allocator<common::Host>_> *hosts)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  __shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  iterator __first;
  iterator __last;
  difference_type dVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  size_t i;
  int num;
  vector<common::Host,_std::allocator<common::Host>_> *hosts_local;
  string *tag_local;
  string *group_local;
  Config *this_local;
  
  i._4_4_ = 0;
  for (v = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::
                  vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                  ::size(&this->m_hosts), v < pvVar4;
      v = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&(v->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1)) {
    p_Var5 = (__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
             ::operator[](&this->m_hosts,(size_type)v);
    peVar6 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var5);
    _Var2 = std::operator==(&peVar6->group,group);
    if (_Var2) {
      p_Var5 = (__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::
               vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
               ::operator[](&this->m_hosts,(size_type)v);
      peVar6 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var5);
      bVar3 = std::__cxx11::string::empty();
      bVar1 = true;
      if ((bVar3 & 1) == 0) {
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(&peVar6->tags);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&peVar6->tags);
        dVar7 = std::
                count<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )__first._M_current,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )__last._M_current,tag);
        bVar1 = 0 < dVar7;
      }
      if (bVar1) {
        p_Var5 = (__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::
                 vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                 ::operator[](&this->m_hosts,(size_type)v);
        peVar6 = std::__shared_ptr_access<common::Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*(p_Var5);
        std::vector<common::Host,_std::allocator<common::Host>_>::push_back(hosts,peVar6);
        i._4_4_ = i._4_4_ + 1;
      }
    }
  }
  return i._4_4_;
}

Assistant:

int Config::GetHosts(const std::string& group, const std::string& tag, std::vector<Host>* hosts) {
    int num = 0;
    for (size_t i = 0; i < m_hosts.size(); i++) {
        if (m_hosts[i]->group == group) {
            std::vector<std::string>& v = m_hosts[i]->tags;
            if (tag.empty() || std::count(v.begin(), v.end(), tag) > 0) {
                hosts->push_back(*m_hosts[i]);
                num++;
            }
        }
    }
    return num;
}